

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O2

void sigfiddle_vibrato(t_sigfiddle *x,t_floatarg vibtime,t_floatarg vibdepth)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (0.0 <= vibtime) {
    fVar3 = vibtime;
  }
  x->x_vibtime = (int)fVar3;
  x->x_vibdepth =
       (t_float)(~-(uint)(0.0 < vibdepth) & 0x447a0000 | (uint)vibdepth & -(uint)(0.0 < vibdepth));
  iVar1 = (int)((fVar3 * x->x_sr * 0.001) / (float)x->x_hop);
  iVar2 = 0x13;
  if (iVar1 < 0x13) {
    iVar2 = iVar1;
  }
  iVar1 = 1;
  if (1 < iVar2) {
    iVar1 = iVar2;
  }
  x->x_vibbins = iVar1;
  return;
}

Assistant:

void sigfiddle_vibrato(t_sigfiddle *x, t_floatarg vibtime, t_floatarg vibdepth)
{
    if (vibtime < 0) vibtime = 0;
    if (vibdepth <= 0) vibdepth = 1000;
    x->x_vibtime = vibtime;
    x->x_vibdepth = vibdepth;
    x->x_vibbins = (x->x_sr * 0.001  * vibtime) / x->x_hop;
    if (x->x_vibbins >= HISTORY) x->x_vibbins = HISTORY - 1;
    if (x->x_vibbins < 1) x->x_vibbins = 1;
}